

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

size_t gz_read(gz_state *state,void *buf,size_t len)

{
  int iVar1;
  uchar *in_RDX;
  gz_state *in_RSI;
  uint *in_RDI;
  uint n;
  size_t got;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar2;
  gz_state *in_stack_ffffffffffffffd8;
  gz_state *state_00;
  
  if (in_RDX == (uchar *)0x0) {
    return 0;
  }
  if (in_RDI[0x1c] != 0) {
    in_RDI[0x1c] = 0;
    iVar1 = gz_skip(in_stack_ffffffffffffffd8,
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (iVar1 == -1) {
      return 0;
    }
  }
  state_00 = (gz_state *)0x0;
  do {
    uVar2 = 0xffffffff;
    if (in_RDX < (uchar *)0xffffffff) {
      uVar2 = (uint)in_RDX;
    }
    if (*in_RDI == 0) {
      if ((in_RDI[0x14] != 0) && (in_RDI[0x22] == 0)) {
        in_RDI[0x15] = 1;
        return (size_t)state_00;
      }
      if ((in_RDI[0x11] != 0) && (in_RDI[10] << 1 <= uVar2)) {
        if (in_RDI[0x11] == 1) {
          iVar1 = gz_load(in_RSI,in_RDX,(uint)((ulong)state_00 >> 0x20),
                          (uint *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
          if (iVar1 == -1) {
            return 0;
          }
        }
        else {
          in_RDI[0x28] = uVar2;
          *(gz_state **)(in_RDI + 0x26) = in_RSI;
          iVar1 = gz_decomp(in_RSI);
          if (iVar1 == -1) {
            return 0;
          }
          uVar2 = *in_RDI;
          *in_RDI = 0;
        }
        goto LAB_001930c9;
      }
      iVar1 = gz_fetch(state_00);
      if (iVar1 == -1) {
        return 0;
      }
    }
    else {
      if (*in_RDI < uVar2) {
        uVar2 = *in_RDI;
      }
      memcpy(in_RSI,*(void **)(in_RDI + 2),(ulong)uVar2);
      *(ulong *)(in_RDI + 2) = *(long *)(in_RDI + 2) + (ulong)uVar2;
      *in_RDI = *in_RDI - uVar2;
LAB_001930c9:
      in_RDX = in_RDX + -(ulong)uVar2;
      in_RSI = (gz_state *)((long)&(in_RSI->x).have + (ulong)uVar2);
      state_00 = (gz_state *)((long)&(state_00->x).have + (ulong)uVar2);
      *(ulong *)(in_RDI + 4) = (ulong)uVar2 + *(long *)(in_RDI + 4);
    }
    if (in_RDX == (uchar *)0x0) {
      return (size_t)state_00;
    }
  } while( true );
}

Assistant:

static size_t gz_read(gz_state *state, void *buf, size_t len) {
    size_t got;
    unsigned n;

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return 0;
    }

    /* get len bytes to buf, or less than len if at the end */
    got = 0;
    do {
        /* set n to the maximum amount of len that fits in an unsigned int */
        n = (unsigned)-1;
        if (n > len)
            n = (unsigned)len;

        /* first just try copying data from the output buffer */
        if (state->x.have) {
            if (state->x.have < n)
                n = state->x.have;
            memcpy(buf, state->x.next, n);
            state->x.next += n;
            state->x.have -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0) {
            state->past = 1;        /* tried to read past end */
            break;
        }

        /* need output data -- for small len or new stream load up our output
           buffer */
        else if (state->how == LOOK || n < (state->size << 1)) {
            /* get more output, looking for header if required */
            if (gz_fetch(state) == -1)
                return 0;
            continue;       /* no progress yet -- go back to copy above */
            /* the copy above assures that we will leave with space in the
               output buffer, allowing at least one gzungetc() to succeed */
        }

        /* large len -- read directly into user buffer */
        else if (state->how == COPY) {      /* read directly */
            if (gz_load(state, (unsigned char *)buf, n, &n) == -1)
                return 0;
        }

        /* large len -- decompress directly into user buffer */
        else {  /* state->how == GZIP */
            state->strm.avail_out = n;
            state->strm.next_out = (unsigned char *)buf;
            if (gz_decomp(state) == -1)
                return 0;
            n = state->x.have;
            state->x.have = 0;
        }

        /* update progress */
        len -= n;
        buf = (char *)buf + n;
        got += n;
        state->x.pos += n;
    } while (len);

    /* return number of bytes read into user buffer */
    return got;
}